

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *This)

{
  uint32_t uVar1;
  
  if (This->supercompressionScheme < KTX_SS_ZSTD) {
    __assert_fail("This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x6d5,"ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *)");
  }
  if (This->vkFormat != 0) {
    uVar1 = lcm4((This->_protected->_formatSize).blockSizeInBits >> 3);
    return uVar1;
  }
  return 0x10;
}

Assistant:

ktx_uint32_t
ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2* This)
{
    ktx_uint32_t alignment;

    // Should actually work for none supercompressed but don't want to
    // encourage use of it.
    assert(This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ);

    if (This->vkFormat != VK_FORMAT_UNDEFINED)
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    else
        alignment = 16;

    return alignment;
}